

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwt.c
# Opt level: O0

void opj_idwt53_h_cas1(OPJ_INT32 *tmp,OPJ_INT32 sn,OPJ_INT32 len,OPJ_INT32 *tiledp)

{
  int iVar1;
  int iVar2;
  int *piVar3;
  int local_44;
  OPJ_INT32 dn;
  OPJ_INT32 dc;
  OPJ_INT32 s2;
  OPJ_INT32 s1;
  OPJ_INT32 *in_odd;
  OPJ_INT32 *in_even;
  OPJ_INT32 j;
  OPJ_INT32 i;
  OPJ_INT32 *tiledp_local;
  OPJ_INT32 len_local;
  OPJ_INT32 sn_local;
  OPJ_INT32 *tmp_local;
  
  piVar3 = tiledp + sn;
  if (2 < len) {
    dc = piVar3[1];
    local_44 = *tiledp - (*piVar3 + dc + 2 >> 2);
    *tmp = *piVar3 + local_44;
    in_even._0_4_ = 1;
    for (in_even._4_4_ = 1;
        in_even._4_4_ < (int)((len + -2) - (uint)(((len & 1U) != 0 ^ 0xffU) & 1));
        in_even._4_4_ = in_even._4_4_ + 2) {
      iVar2 = piVar3[(int)in_even + 1];
      iVar1 = tiledp[(int)in_even] - (dc + iVar2 + 2 >> 2);
      tmp[in_even._4_4_] = local_44;
      tmp[in_even._4_4_ + 1] = dc + (iVar1 + local_44 >> 1);
      in_even._0_4_ = (int)in_even + 1;
      local_44 = iVar1;
      dc = iVar2;
    }
    tmp[in_even._4_4_] = local_44;
    if ((len & 1U) == 0) {
      iVar2 = tiledp[len / 2 + -1] - (dc + 1 >> 1);
      tmp[len + -2] = dc + (iVar2 + local_44 >> 1);
      tmp[len + -1] = iVar2;
    }
    else {
      tmp[len + -1] = dc + local_44;
    }
    memcpy(tiledp,tmp,(ulong)(uint)len << 2);
    return;
  }
  __assert_fail("len > 2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ElMostafaIdrassi[P]OpenJPEGJNI/src/lib/openjp2/dwt.c"
                ,0x205,
                "void opj_idwt53_h_cas1(OPJ_INT32 *, const OPJ_INT32, const OPJ_INT32, OPJ_INT32 *)"
               );
}

Assistant:

static void  opj_idwt53_h_cas1(OPJ_INT32* tmp,
                               const OPJ_INT32 sn,
                               const OPJ_INT32 len,
                               OPJ_INT32* tiledp)
{
    OPJ_INT32 i, j;
    const OPJ_INT32* in_even = &tiledp[sn];
    const OPJ_INT32* in_odd = &tiledp[0];

#ifdef TWO_PASS_VERSION
    /* For documentation purpose: performs lifting in two iterations, */
    /* but without explicit interleaving */

    assert(len > 2);

    /* Odd */
    for (i = 1, j = 0; i < len - 1; i += 2, j++) {
        tmp[i] = in_odd[j] - ((in_even[j] + in_even[j + 1] + 2) >> 2);
    }
    if (!(len & 1)) {
        tmp[len - 1] = in_odd[len / 2 - 1] - ((in_even[len / 2 - 1] + 1) >> 1);
    }

    /* Even */
    tmp[0] = in_even[0] + tmp[1];
    for (i = 2, j = 1; i < len - 1; i += 2, j++) {
        tmp[i] = in_even[j] + ((tmp[i + 1] + tmp[i - 1]) >> 1);
    }
    if (len & 1) {
        tmp[len - 1] = in_even[len / 2] + tmp[len - 2];
    }
#else
    OPJ_INT32 s1, s2, dc, dn;

    assert(len > 2);

    /* Improved version of the TWO_PASS_VERSION: */
    /* Performs lifting in one single iteration. Saves memory */
    /* accesses and explicit interleaving. */

    s1 = in_even[1];
    dc = in_odd[0] - ((in_even[0] + s1 + 2) >> 2);
    tmp[0] = in_even[0] + dc;

    for (i = 1, j = 1; i < (len - 2 - !(len & 1)); i += 2, j++) {

        s2 = in_even[j + 1];

        dn = in_odd[j] - ((s1 + s2 + 2) >> 2);
        tmp[i  ] = dc;
        tmp[i + 1] = s1 + ((dn + dc) >> 1);

        dc = dn;
        s1 = s2;
    }

    tmp[i] = dc;

    if (!(len & 1)) {
        dn = in_odd[len / 2 - 1] - ((s1 + 1) >> 1);
        tmp[len - 2] = s1 + ((dn + dc) >> 1);
        tmp[len - 1] = dn;
    } else {
        tmp[len - 1] = s1 + dc;
    }
#endif
    memcpy(tiledp, tmp, (OPJ_UINT32)len * sizeof(OPJ_INT32));
}